

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O3

int __thiscall
cubeb_mixer::mix(cubeb_mixer *this,size_t frames,void *input_buffer,size_t input_buffer_size,
                void *output_buffer,size_t output_buffer_size)

{
  MixerContext *s;
  int32_t (*matrix_coeff) [32];
  uint uVar1;
  cubeb_sample_format cVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  uint32_t frames_00;
  
  frames_00 = (uint32_t)output_buffer_size;
  iVar3 = 0;
  if ((frames != 0) && (iVar3 = 0, (this->_context)._out_ch_count != 0)) {
    uVar1 = (this->_context)._in_ch_count;
    sVar4 = cubeb_sample_size((this->_context)._format);
    uVar5 = sVar4 * uVar1 * frames;
    iVar3 = -1;
    if ((uVar5 < input_buffer_size || uVar5 - input_buffer_size == 0) &&
       (uVar5 * (this->_context)._out_ch_count <= (this->_context)._in_ch_count * output_buffer_size
       )) {
      cVar2 = (this->_context)._format;
      if ((this->_context)._valid == false) {
        if (cVar2 == CUBEB_SAMPLE_FLOAT32LE) {
          copy_and_trunc<float>(this,frames,(float *)input_buffer,(float *)output_buffer);
        }
        else {
          copy_and_trunc<short>(this,frames,(short *)input_buffer,(short *)output_buffer);
        }
      }
      else {
        s = &this->_context;
        if (cVar2 == CUBEB_SAMPLE_S16LE) {
          matrix_coeff = (this->_context)._matrix32;
          if ((this->_context)._clipping == true) {
            rematrix<short,int,32ul,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(int)_1_&>
                      (s,(short *)output_buffer,(short *)input_buffer,
                       (int (*) [32] [32])matrix_coeff,
                       (anon_class_1_0_00000001 *)(frames & 0xffffffff),frames_00);
          }
          else {
            rematrix<short,int,32ul,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(int)_2_&>
                      (s,(short *)output_buffer,(short *)input_buffer,
                       (int (*) [32] [32])matrix_coeff,
                       (anon_class_1_0_00000001 *)(frames & 0xffffffff),frames_00);
          }
        }
        else {
          if (cVar2 != CUBEB_SAMPLE_FLOAT32LE) {
            return -1;
          }
          rematrix<float,float,32ul,cubeb_mixer::mix(unsigned_long,void_const*,unsigned_long,void*,unsigned_long)const::_lambda(float)_1_&>
                    (s,(float *)output_buffer,(float *)input_buffer,&(this->_context)._matrix_flt,
                     (anon_class_1_0_00000001 *)(frames & 0xffffffff),frames_00);
        }
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mix(size_t frames,
          const void * input_buffer,
          size_t input_buffer_size,
          void * output_buffer,
          size_t output_buffer_size) const
  {
    if (frames <= 0 || _context._out_ch_count == 0) {
      return 0;
    }

    // Check if output buffer is of sufficient size.
    size_t size_read_needed =
      frames * _context._in_ch_count * cubeb_sample_size(_context._format);
    if (input_buffer_size < size_read_needed) {
      // We don't have enough data to read!
      return -1;
    }
    if (output_buffer_size * _context._in_ch_count <
        size_read_needed * _context._out_ch_count) {
      return -1;
    }

    if (!valid()) {
      // The channel layouts were invalid or unsupported, instead we will simply
      // either drop the extra channels, or fill with silence the missing ones
      if (_context._format == CUBEB_SAMPLE_FLOAT32NE) {
        copy_and_trunc(frames,
                       static_cast<const float*>(input_buffer),
                       static_cast<float*>(output_buffer));
      } else {
        assert(_context._format == CUBEB_SAMPLE_S16NE);
        copy_and_trunc(frames,
                       static_cast<const int16_t*>(input_buffer),
                       reinterpret_cast<int16_t*>(output_buffer));
      }
      return 0;
    }

    switch (_context._format)
    {
      case CUBEB_SAMPLE_FLOAT32NE: {
        auto f = [](float x) { return x; };
        return rematrix(&_context,
                        static_cast<float*>(output_buffer),
                        static_cast<const float*>(input_buffer),
                        _context._matrix_flt,
                        f,
                        frames);
      }
      case CUBEB_SAMPLE_S16NE:
        if (_context._clipping) {
          auto f = [](int x) {
            int y = (x + 16384) >> 15;
            // clip the signed integer value into the -32768,32767 range.
            if ((y + 0x8000U) & ~0xFFFF) {
              return (y >> 31) ^ 0x7FFF;
            }
            return y;
          };
          return rematrix(&_context,
                          static_cast<int16_t*>(output_buffer),
                          static_cast<const int16_t*>(input_buffer),
                          _context._matrix32,
                          f,
                          frames);
        } else {
          auto f = [](int x) { return (x + 16384) >> 15; };
          return rematrix(&_context,
                          static_cast<int16_t*>(output_buffer),
                          static_cast<const int16_t*>(input_buffer),
                          _context._matrix32,
                          f,
                          frames);
        }
        break;
      default:
        assert(false);
        break;
    }

    return -1;
  }